

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O0

void __thiscall Metrics::Report(Metrics *this)

{
  int iVar1;
  Metric *pMVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  uint *puVar7;
  reference ppMVar8;
  undefined8 uVar9;
  double avg;
  double total;
  Metric *metric;
  __normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_> local_38;
  iterator i_1;
  __normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_> local_28;
  __normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_> local_20;
  iterator i;
  int width;
  Metrics *this_local;
  
  i._M_current._4_4_ = 0;
  local_20._M_current =
       (Metric **)std::vector<Metric_*,_std::allocator<Metric_*>_>::begin(&this->metrics_);
  while( true ) {
    local_28._M_current =
         (Metric **)std::vector<Metric_*,_std::allocator<Metric_*>_>::end(&this->metrics_);
    bVar6 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar6) break;
    __gnu_cxx::__normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_>::
    operator*(&local_20);
    i_1._M_current._4_4_ = std::__cxx11::string::size();
    puVar7 = (uint *)std::max<int>((int *)((long)&i_1._M_current + 4),
                                   (int *)((long)&i._M_current + 4));
    i._M_current._4_4_ = *puVar7;
    __gnu_cxx::__normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_>::
    operator++(&local_20);
  }
  printf("%-*s\t%-6s\t%-9s\t%s\n",(ulong)i._M_current._4_4_,"metric","count","avg (us)","total (ms)"
        );
  local_38._M_current =
       (Metric **)std::vector<Metric_*,_std::allocator<Metric_*>_>::begin(&this->metrics_);
  while( true ) {
    metric = (Metric *)std::vector<Metric_*,_std::allocator<Metric_*>_>::end(&this->metrics_);
    bVar6 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_>
                        *)&metric);
    if (!bVar6) break;
    ppMVar8 = __gnu_cxx::
              __normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_>::
              operator*(&local_38);
    uVar5 = i._M_current._4_4_;
    pMVar2 = *ppMVar8;
    lVar3 = pMVar2->sum;
    lVar4 = pMVar2->sum;
    iVar1 = pMVar2->count;
    uVar9 = std::__cxx11::string::c_str();
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n",(double)lVar4 / (double)iVar1,(double)lVar3 / 1000.0,
           (ulong)uVar5,uVar9,(ulong)(uint)pMVar2->count);
    __gnu_cxx::__normal_iterator<Metric_**,_std::vector<Metric_*,_std::allocator<Metric_*>_>_>::
    operator++(&local_38);
  }
  return;
}

Assistant:

void Metrics::Report() {
  int width = 0;
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    width = max((int)(*i)->name.size(), width);
  }

  printf("%-*s\t%-6s\t%-9s\t%s\n", width,
         "metric", "count", "avg (us)", "total (ms)");
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    Metric* metric = *i;
    double total = metric->sum / (double)1000;
    double avg = metric->sum / (double)metric->count;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n", width, metric->name.c_str(),
           metric->count, avg, total);
  }
}